

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_write_mct_data_group
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  opj_image_t *poVar1;
  opj_tcp_t *poVar2;
  OPJ_BYTE *pOVar3;
  OPJ_SIZE_T OVar4;
  OPJ_UINT32 *pOVar5;
  opj_simple_mcc_decorrelation_data_t *poVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  OPJ_UINT32 OVar13;
  uint uVar14;
  bool bVar15;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x14af,
                  "OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_stream == (opj_stream_private *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x14b0,
                  "OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager == (opj_event_mgr *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x14b1,
                  "OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  poVar1 = p_j2k->m_private_image;
  OVar13 = poVar1->numcomps;
  uVar7 = OVar13 + 6;
  uVar10 = (ulong)uVar7;
  if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar7) {
    pOVar3 = (OPJ_BYTE *)opj_realloc((p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar10);
    if (pOVar3 == (OPJ_BYTE *)0x0) {
      opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
      (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
      (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
      opj_event_msg(p_manager,1,"Not enough memory to write CBD marker\n");
      return 0;
    }
    (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar3;
    (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar7;
  }
  pOVar3 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
  opj_write_bytes_LE(pOVar3,0xff78,2);
  opj_write_bytes_LE(pOVar3 + 2,OVar13 + 4,2);
  opj_write_bytes_LE(pOVar3 + 4,poVar1->numcomps,2);
  if (poVar1->numcomps != 0) {
    pOVar5 = &poVar1->comps->sgnd;
    lVar11 = 0;
    do {
      opj_write_bytes_LE(pOVar3 + lVar11 + 6,pOVar5[-2] - 1 | *pOVar5 << 7,1);
      pOVar5 = pOVar5 + 0x10;
      lVar11 = lVar11 + 1;
    } while ((uint)lVar11 < poVar1->numcomps);
  }
  OVar4 = opj_stream_write_data
                    (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar10,
                     p_manager);
  uVar7 = 0;
  if (OVar4 == uVar10) {
    poVar2 = (p_j2k->m_cp).tcps;
    uVar7 = p_j2k->m_current_tile_number;
    if (poVar2[uVar7].m_nb_mct_records != 0) {
      pOVar5 = &(poVar2[uVar7].m_mct_records)->m_data_size;
      uVar14 = 0;
      do {
        uVar9 = *pOVar5;
        uVar8 = uVar9 + 10;
        uVar10 = (ulong)uVar8;
        if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar8) {
          pOVar3 = (OPJ_BYTE *)
                   opj_realloc((p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar10);
          if (pOVar3 == (OPJ_BYTE *)0x0) {
            opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
            (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
            (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
            opj_event_msg(p_manager,1,"Not enough memory to write MCT marker\n");
            return 0;
          }
          (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar3;
          (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar8;
        }
        pOVar3 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
        opj_write_bytes_LE(pOVar3,0xff74,2);
        opj_write_bytes_LE(pOVar3 + 2,uVar9 + 8,2);
        opj_write_bytes_LE(pOVar3 + 4,0,2);
        opj_write_bytes_LE(pOVar3 + 6,
                           ((opj_mct_data_t *)(pOVar5 + -6))->m_element_type << 10 |
                           pOVar5[-5] << 8 | (uint)(byte)pOVar5[-4],2);
        opj_write_bytes_LE(pOVar3 + 8,0,2);
        memcpy(pOVar3 + 10,*(OPJ_BYTE **)(pOVar5 + -2),(ulong)*pOVar5);
        OVar4 = opj_stream_write_data
                          (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar10,
                           p_manager);
        if (OVar4 != uVar10) {
          return 0;
        }
        uVar14 = uVar14 + 1;
        pOVar5 = pOVar5 + 8;
      } while (uVar14 < poVar2[uVar7].m_nb_mct_records);
    }
    if (poVar2[uVar7].m_nb_mcc_records != 0) {
      poVar6 = poVar2[uVar7].m_mcc_records;
      uVar14 = 0;
      do {
        bVar15 = 0xff < poVar6->m_nb_comps;
        iVar12 = poVar6->m_nb_comps * 2 << bVar15;
        uVar8 = iVar12 + 0x13;
        uVar10 = (ulong)uVar8;
        if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar8) {
          pOVar3 = (OPJ_BYTE *)
                   opj_realloc((p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar10);
          if (pOVar3 == (OPJ_BYTE *)0x0) {
            opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
            (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
            (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
            opj_event_msg(p_manager,1,"Not enough memory to write MCC marker\n");
            return 0;
          }
          (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar3;
          (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar8;
        }
        uVar9 = bVar15 + 1;
        pOVar3 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
        opj_write_bytes_LE(pOVar3,0xff75,2);
        opj_write_bytes_LE(pOVar3 + 2,iVar12 + 0x11,2);
        opj_write_bytes_LE(pOVar3 + 4,0,2);
        opj_write_bytes_LE(pOVar3 + 6,poVar6->m_index,1);
        opj_write_bytes_LE(pOVar3 + 7,0,2);
        opj_write_bytes_LE(pOVar3 + 9,1,2);
        opj_write_bytes_LE(pOVar3 + 0xb,1,1);
        opj_write_bytes_LE(pOVar3 + 0xc,poVar6->m_nb_comps | (uint)bVar15 << 0xf,2);
        pOVar3 = pOVar3 + 0xe;
        uVar8 = poVar6->m_nb_comps;
        if (uVar8 != 0) {
          OVar13 = 0;
          do {
            opj_write_bytes_LE(pOVar3,OVar13,uVar9);
            pOVar3 = pOVar3 + uVar9;
            OVar13 = OVar13 + 1;
            uVar8 = poVar6->m_nb_comps;
          } while (OVar13 < uVar8);
        }
        opj_write_bytes_LE(pOVar3,uVar8 | (uint)bVar15 << 0xf,2);
        pOVar3 = pOVar3 + 2;
        if (poVar6->m_nb_comps != 0) {
          OVar13 = 0;
          do {
            opj_write_bytes_LE(pOVar3,OVar13,uVar9);
            pOVar3 = pOVar3 + uVar9;
            OVar13 = OVar13 + 1;
          } while (OVar13 < poVar6->m_nb_comps);
        }
        OVar13 = (~*(uint *)&poVar6->field_0x18 & 1) << 0x10;
        if (poVar6->m_decorrelation_array != (opj_mct_data_t *)0x0) {
          OVar13 = OVar13 | poVar6->m_decorrelation_array->m_index;
        }
        if (poVar6->m_offset_array != (opj_mct_data_t *)0x0) {
          OVar13 = OVar13 | poVar6->m_offset_array->m_index << 8;
        }
        opj_write_bytes_LE(pOVar3,OVar13,3);
        OVar4 = opj_stream_write_data
                          (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar10,
                           p_manager);
        if (OVar4 != uVar10) {
          return 0;
        }
        poVar6 = poVar6 + 1;
        uVar14 = uVar14 + 1;
      } while (uVar14 < poVar2[uVar7].m_nb_mcc_records);
    }
    poVar2 = (p_j2k->m_cp).tcps;
    uVar14 = p_j2k->m_current_tile_number;
    OVar13 = poVar2[uVar14].m_nb_mcc_records;
    uVar7 = OVar13 + 5;
    uVar10 = (ulong)uVar7;
    if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar7) {
      pOVar3 = (OPJ_BYTE *)
               opj_realloc((p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar10);
      if (pOVar3 == (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
        (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
        (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
        opj_event_msg(p_manager,1,"Not enough memory to write MCO marker\n");
        return 0;
      }
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar3;
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar7;
    }
    pOVar3 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    opj_write_bytes_LE(pOVar3,0xff77,2);
    opj_write_bytes_LE(pOVar3 + 2,OVar13 + 3,2);
    opj_write_bytes_LE(pOVar3 + 4,poVar2[uVar14].m_nb_mcc_records,1);
    if (poVar2[uVar14].m_nb_mcc_records != 0) {
      poVar6 = poVar2[uVar14].m_mcc_records;
      lVar11 = 0;
      do {
        opj_write_bytes_LE(pOVar3 + lVar11 + 5,poVar6->m_index,1);
        poVar6 = poVar6 + 1;
        lVar11 = lVar11 + 1;
      } while ((uint)lVar11 < poVar2[uVar14].m_nb_mcc_records);
    }
    OVar4 = opj_stream_write_data
                      (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar10,
                       p_manager);
    uVar7 = (uint)(OVar4 == uVar10);
  }
  return uVar7;
}

Assistant:

static OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *p_j2k,
        struct opj_stream_private *p_stream,
        struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 i;
    opj_simple_mcc_decorrelation_data_t * l_mcc_record;
    opj_mct_data_t * l_mct_record;
    opj_tcp_t * l_tcp;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    if (! opj_j2k_write_cbd(p_j2k, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    l_tcp = &(p_j2k->m_cp.tcps[p_j2k->m_current_tile_number]);
    l_mct_record = l_tcp->m_mct_records;

    for (i = 0; i < l_tcp->m_nb_mct_records; ++i) {

        if (! opj_j2k_write_mct_record(p_j2k, l_mct_record, p_stream, p_manager)) {
            return OPJ_FALSE;
        }

        ++l_mct_record;
    }

    l_mcc_record = l_tcp->m_mcc_records;

    for (i = 0; i < l_tcp->m_nb_mcc_records; ++i) {

        if (! opj_j2k_write_mcc_record(p_j2k, l_mcc_record, p_stream, p_manager)) {
            return OPJ_FALSE;
        }

        ++l_mcc_record;
    }

    if (! opj_j2k_write_mco(p_j2k, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}